

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void reallymarkobject(global_State *g,GCObject *o)

{
  int iVar1;
  GCObject *o_00;
  byte bVar2;
  Table *pTVar3;
  UpVal *uv;
  
  bVar2 = (o->gch).marked;
  do {
    (o->gch).marked = bVar2 & 0xfc;
    if ((o->gch).tt != '\a') {
      switch((o->gch).tt) {
      case '\x05':
        (o->h).gclist = g->gray;
        break;
      case '\x06':
        (o->h).metatable = (Table *)g->gray;
        break;
      default:
        goto switchD_00104705_caseD_7;
      case '\b':
        (o->th).gclist = g->gray;
        break;
      case '\t':
        (o->p).gclist = g->gray;
        break;
      case '\n':
        pTVar3 = (o->h).metatable;
        iVar1._0_1_ = pTVar3->tt;
        iVar1._1_1_ = pTVar3->marked;
        iVar1._2_1_ = pTVar3->flags;
        iVar1._3_1_ = pTVar3->lsizenode;
        if ((3 < iVar1) && (((pTVar3->next->gch).marked & 3) != 0)) {
          reallymarkobject(g,pTVar3->next);
          pTVar3 = (o->h).metatable;
        }
        if (pTVar3 == (Table *)&(o->h).array) {
          (o->gch).marked = (o->gch).marked | 4;
        }
        goto switchD_00104705_caseD_7;
      }
      g->gray = o;
      return;
    }
    o_00 = (GCObject *)(o->h).metatable;
    (o->gch).marked = bVar2 & 0xfc | 4;
    if ((o_00 != (GCObject *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      reallymarkobject(g,o_00);
    }
    o = (GCObject *)(o->h).array;
    bVar2 = (o->gch).marked;
  } while ((bVar2 & 3) != 0);
switchD_00104705_caseD_7:
  return;
}

Assistant:

static void reallymarkobject(global_State*g,GCObject*o){
white2gray(o);
switch(o->gch.tt){
case 4:{
return;
}
case 7:{
Table*mt=gco2u(o)->metatable;
gray2black(o);
if(mt)markobject(g,mt);
markobject(g,gco2u(o)->env);
return;
}
case(8+2):{
UpVal*uv=gco2uv(o);
markvalue(g,uv->v);
if(uv->v==&uv->u.value)
gray2black(o);
return;
}
case 6:{
gco2cl(o)->c.gclist=g->gray;
g->gray=o;
break;
}
case 5:{
gco2h(o)->gclist=g->gray;
g->gray=o;
break;
}
case 8:{
gco2th(o)->gclist=g->gray;
g->gray=o;
break;
}
case(8+1):{
gco2p(o)->gclist=g->gray;
g->gray=o;
break;
}
default:;
}
}